

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void do_cmd_inven(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  object *local_30;
  
  local_30 = (object *)0x0;
  if (*player->upkeep->inven == (object *)0x0) {
    msg("You have nothing in your inventory.");
    return;
  }
  player->upkeep->command_wrk = L'\x02';
  screen_save();
  _Var1 = get_item(&local_30,"Select Item:","Error in do_cmd_inven(), please report.",CMD_NULL,
                   (item_tester)0x0,L'Ɵ');
  screen_load();
  if (_Var1) {
    do {
      if ((local_30 != (object *)0x0) && (local_30->kind != (object_kind *)0x0)) {
        track_object(player->upkeep,local_30);
        _Var1 = player_is_shapechanged(player);
        if (!_Var1) {
          do {
            wVar2 = context_menu_object(local_30);
          } while (wVar2 == L'\x02');
          if (wVar2 != L'\x03') {
            return;
          }
        }
      }
      screen_save();
      _Var1 = get_item(&local_30,"Select Item:","Error in do_cmd_inven(), please report.",CMD_NULL,
                       (item_tester)0x0,L'Ɵ');
      screen_load();
    } while (_Var1);
  }
  return;
}

Assistant:

void do_cmd_inven(void)
{
	struct object *obj = NULL;
	int ret = 3;

	if (player->upkeep->inven[0] == NULL) {
		msg("You have nothing in your inventory.");
		return;
	}

	/* Start in "inventory" mode */
	player->upkeep->command_wrk = (USE_INVEN);

	/* Loop this menu until an object context menu says differently */
	while (ret == 3) {
		/* Save screen */
		screen_save();

		/* Get an item to use a context command on (Display the inventory) */
		if (get_item(&obj, "Select Item:",
				"Error in do_cmd_inven(), please report.",
				CMD_NULL, NULL, GET_ITEM_PARAMS)) {
			/* Load screen */
			screen_load();

			if (obj && obj->kind) {
				/* Track the object */
				track_object(player->upkeep, obj);

				if (!player_is_shapechanged(player)) {
					while ((ret = context_menu_object(obj)) == 2);
				}
			}
		} else {
			/* Load screen */
			screen_load();

			ret = -1;
		}
	}
}